

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

bool __thiscall
OpenMD::SelectionEvaluator::loadScript(SelectionEvaluator *this,string *filename,string *script)

{
  bool bVar1;
  undefined8 uVar2;
  iterator tokens;
  string *in_RDX;
  string *in_RSI;
  __normal_iterator<const_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_*,_std::vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>_>
  *in_RDI;
  const_iterator i;
  SelectionCompiler *in_stack_ffffffffffffff48;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  SelectionEvaluator *in_stack_ffffffffffffff68;
  __normal_iterator<const_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_*,_std::vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>_>
  local_90;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  SelectionCompiler *in_stack_ffffffffffffff88;
  SelectionCompiler *in_stack_ffffffffffffffb8;
  string local_40 [32];
  string *local_20;
  string *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  clearDefinitionsAndLoadPredefined((SelectionEvaluator *)0x33a061);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x27),local_18);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x2b),local_20);
  bVar1 = SelectionCompiler::compile
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    *(undefined4 *)&in_RDI[0x38]._M_current = 0;
    SelectionCompiler::getAatokenCompiled(in_stack_ffffffffffffff48);
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::operator=((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                 *)in_stack_ffffffffffffff60,
                (vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                 *)in_stack_ffffffffffffff58);
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::~vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
               *)in_stack_ffffffffffffff60);
    SelectionCompiler::getLineNumbers(in_stack_ffffffffffffff48);
    std::vector<int,_std::allocator<int>_>::operator=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
    SelectionCompiler::getLineIndices(in_stack_ffffffffffffff48);
    std::vector<int,_std::allocator<int>_>::operator=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
    __gnu_cxx::
    __normal_iterator<const_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_*,_std::vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>_>
    ::__normal_iterator(&local_90);
    *(undefined1 *)&in_RDI[0xa6]._M_current = 0;
    tokens = std::
             vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             ::begin((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                      *)in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>const*,std::vector<std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>,std::allocator<std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>>>>
    ::__normal_iterator<std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>*>
              (in_RDI,(__normal_iterator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_*,_std::vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>_>
                       *)in_stack_ffffffffffffff48);
    while( true ) {
      std::
      vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
      ::end((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             *)in_stack_ffffffffffffff48);
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_*,_std::vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>_>
                                 *)in_stack_ffffffffffffff48);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_*,_std::vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>_>
      ::operator*(&local_90);
      bVar1 = containDynamicToken(in_stack_ffffffffffffff68,tokens._M_current);
      if (bVar1) {
        *(undefined1 *)&in_RDI[0xa6]._M_current = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_*,_std::vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>_>
      ::operator++(&local_90);
    }
    *(undefined1 *)((long)&in_RDI[0xa6]._M_current + 1) = 1;
    local_1 = true;
  }
  else {
    *(undefined1 *)((long)&in_RDI[0x38]._M_current + 4) = 1;
    SelectionCompiler::getErrorMessage_abi_cxx11_(in_stack_ffffffffffffffb8);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x39),local_40);
    std::__cxx11::string::~string(local_40);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"SelectionCompiler Error: %s\n",uVar2);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SelectionEvaluator::loadScript(const std::string& filename,
                                      const std::string& script) {
    clearDefinitionsAndLoadPredefined();
    this->filename = filename;
    this->script   = script;
    if (!compiler.compile(filename, script)) {
      error        = true;
      errorMessage = compiler.getErrorMessage();

      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SelectionCompiler Error: %s\n", errorMessage.c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      return false;
    }

    pc          = 0;
    aatoken     = compiler.getAatokenCompiled();
    linenumbers = compiler.getLineNumbers();
    lineIndices = compiler.getLineIndices();

    std::vector<std::vector<Token>>::const_iterator i;

    isDynamic_ = false;
    for (i = aatoken.begin(); i != aatoken.end(); ++i) {
      if (containDynamicToken(*i)) {
        isDynamic_ = true;
        break;
      }
    }

    isLoaded_ = true;
    return true;
  }